

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

int pbrt::GenerateLightSubpath
              (Integrator *integrator,SampledWavelengths *lambda,SamplerHandle *sampler,
              CameraHandle *camera,ScratchBuffer *scratchBuffer,int maxDepth,Float time,
              LightSamplerHandle *lightSampler,Vertex *path,bool regularize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  SampledLight *pSVar9;
  int iVar10;
  uint uVar11;
  int in_R9D;
  type tVar12;
  Float FVar13;
  Point2f PVar14;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar15;
  undefined8 uVar16;
  SampledSpectrum SVar17;
  long in_stack_00000010;
  byte in_stack_00000018;
  int nVertices;
  SampledSpectrum beta;
  undefined1 in_stack_0000030b;
  Float in_stack_0000030c;
  ScratchBuffer *in_stack_00000310;
  CameraHandle *in_stack_00000318;
  SamplerHandle *in_stack_00000320;
  RayDifferential *in_stack_00000328;
  SampledWavelengths *in_stack_00000330;
  RayDifferential ray;
  LightLeSample les;
  Float lightPDF;
  LightHandle light;
  optional<pbrt::SampledLight> sampledLight;
  undefined4 in_stack_fffffffffffffb48;
  Float in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 uVar18;
  Float in_stack_fffffffffffffb54;
  SampledSpectrum *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  Float in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  Float in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbb0;
  Float in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  Float in_stack_fffffffffffffbbc;
  Ray *in_stack_fffffffffffffbc0;
  Interaction *in_stack_fffffffffffffbc8;
  Ray *in_stack_fffffffffffffbd0;
  LightHandle *in_stack_fffffffffffffbd8;
  Vector3f *in_stack_fffffffffffffc80;
  LightSamplerHandle *in_stack_fffffffffffffc88;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffc90;
  undefined1 local_110 [144];
  float local_80;
  float local_7c;
  Float local_74;
  undefined4 local_68;
  optional local_58 [31];
  byte local_39;
  int local_34;
  int local_4;
  
  local_39 = in_stack_00000018 & 1;
  if (in_R9D == 0) {
    local_4 = 0;
  }
  else {
    local_34 = in_R9D;
    SamplerHandle::Get1D
              ((SamplerHandle *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    LightSamplerHandle::Sample
              ((LightSamplerHandle *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
               in_stack_fffffffffffffb64);
    bVar7 = pstd::optional::operator_cast_to_bool(local_58);
    if (bVar7) {
      pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x7ecd90);
      LightHandle::LightHandle
                ((LightHandle *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (LightHandle *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      pSVar9 = pstd::optional<pbrt::SampledLight>::operator->
                         ((optional<pbrt::SampledLight> *)0x7ecdbe);
      local_74 = pSVar9->pdf;
      PVar14 = SamplerHandle::Get2D
                         ((SamplerHandle *)
                          CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      auVar6._8_8_ = extraout_XMM0_Qb;
      auVar6._0_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.x;
      auVar6._4_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.y;
      vmovlpd_avx(auVar6);
      PVar14 = SamplerHandle::Get2D
                         ((SamplerHandle *)
                          CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      auVar5._8_8_ = extraout_XMM0_Qb_00;
      auVar5._0_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.x;
      auVar5._4_4_ = PVar14.super_Tuple2<pbrt::Point2,_float>.y;
      vmovlpd_avx(auVar5);
      LightHandle::SampleLe
                ((LightHandle *)in_stack_fffffffffffffbc8,(Point2f *)in_stack_fffffffffffffbc0,
                 (Point2f *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (SampledWavelengths *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0)
                 ,in_stack_fffffffffffffbac);
      bVar7 = LightLeSample::operator_cast_to_bool((LightLeSample *)local_110);
      if ((((bVar7) && ((local_80 != 0.0 || (NAN(local_80))))) &&
          ((local_7c != 0.0 || (NAN(local_7c))))) &&
         (bVar7 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffffb58), bVar7)) {
        RayDifferential::RayDifferential
                  ((RayDifferential *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (Ray *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        bVar7 = pstd::optional::operator_cast_to_bool((optional *)(local_110 + 0x38));
        if (bVar7) {
          LightHandle::LightHandle
                    ((LightHandle *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     (LightHandle *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          pstd::optional<pbrt::Interaction>::operator*((optional<pbrt::Interaction> *)0x7ecf7d);
          uVar16 = 0;
          Vertex::CreateLight(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                              in_stack_fffffffffffffbc8,(SampledSpectrum *)in_stack_fffffffffffffbc0
                              ,in_stack_fffffffffffffbbc);
        }
        else {
          LightHandle::LightHandle
                    ((LightHandle *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     (LightHandle *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          uVar16 = 0;
          Vertex::CreateLight((LightHandle *)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                              (SampledSpectrum *)
                              CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                              in_stack_fffffffffffffbb4);
        }
        Vertex::operator=((Vertex *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          (Vertex *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        LightLeSample::AbsCosTheta
                  ((LightLeSample *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (Vector3f *)in_stack_fffffffffffffb58);
        uVar15 = 0;
        SVar17 = SampledSpectrum::operator*
                           ((SampledSpectrum *)
                            CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                            in_stack_fffffffffffffb4c);
        auVar3._8_8_ = uVar16;
        auVar3._0_8_ = SVar17.values.values._8_8_;
        auVar4._8_8_ = uVar15;
        auVar4._0_8_ = SVar17.values.values._0_8_;
        vmovlpd_avx(auVar4);
        vmovlpd_avx(auVar3);
        uVar15 = 0;
        uVar16 = 0;
        SVar17 = SampledSpectrum::operator/(in_stack_fffffffffffffb58,in_stack_fffffffffffffb54);
        auVar1._8_4_ = (int)uVar15;
        auVar1._0_8_ = SVar17.values.values._8_8_;
        auVar1._12_4_ = (int)((ulong)uVar15 >> 0x20);
        auVar2._8_8_ = uVar16;
        auVar2._0_8_ = SVar17.values.values._0_8_;
        vmovlpd_avx(auVar2);
        vmovlpd_avx(auVar1);
        RayDifferential::RayDifferential
                  ((RayDifferential *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (RayDifferential *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48))
        ;
        SamplerHandle::SamplerHandle
                  ((SamplerHandle *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (SamplerHandle *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        CameraHandle::CameraHandle
                  ((CameraHandle *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   (CameraHandle *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        iVar10 = local_34 + -1;
        uVar11 = local_39 & 1;
        uVar18 = 1;
        iVar8 = RandomWalk((Integrator *)ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_,
                           in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000318,
                           in_stack_00000310,(SampledSpectrum)ray.super_Ray._12_16_,
                           in_stack_0000030c,ray._40_4_,
                           (TransportMode)ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y,
                           (Vertex *)ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>._0_8_,
                           (bool)in_stack_0000030b);
        bVar7 = Vertex::IsInfiniteLight((Vertex *)CONCAT44(in_stack_fffffffffffffb64,uVar11));
        if (bVar7) {
          if (0 < iVar8) {
            *(float *)(in_stack_00000010 + 0x2b4) = local_80;
            bVar7 = Vertex::IsOnSurface((Vertex *)CONCAT44(in_stack_fffffffffffffb64,uVar11));
            if (bVar7) {
              Vertex::ng((Vertex *)0x7ed29e);
              tVar12 = AbsDot<float>((Vector3<float> *)CONCAT44(in_stack_fffffffffffffb54,uVar18),
                                     (Normal3<float> *)CONCAT44(in_stack_fffffffffffffb4c,iVar10));
              *(float *)(in_stack_00000010 + 0x2b4) = tVar12 * *(float *)(in_stack_00000010 + 0x2b4)
              ;
            }
          }
          LightSamplerHandle::LightSamplerHandle
                    ((LightSamplerHandle *)CONCAT44(in_stack_fffffffffffffb54,uVar18),
                     (LightSamplerHandle *)CONCAT44(in_stack_fffffffffffffb4c,iVar10));
          FVar13 = InfiniteLightDensity
                             (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                              in_stack_fffffffffffffc80);
          *(Float *)(in_stack_00000010 + 0x154) = FVar13;
        }
        local_4 = iVar8 + 1;
      }
      else {
        local_4 = 0;
      }
      local_68 = 1;
      LightLeSample::~LightLeSample((LightLeSample *)0x7ed365);
    }
    else {
      local_4 = 0;
      local_68 = 1;
    }
    pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x7ed372);
  }
  return local_4;
}

Assistant:

int GenerateLightSubpath(const Integrator &integrator, SampledWavelengths &lambda,
                         SamplerHandle sampler, CameraHandle camera,
                         ScratchBuffer &scratchBuffer, int maxDepth, Float time,
                         LightSamplerHandle lightSampler, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Sample initial ray for light subpath
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(sampler.Get1D());
    if (!sampledLight)
        return 0;
    LightHandle light = sampledLight->light;
    Float lightPDF = sampledLight->pdf;
    LightLeSample les = light.SampleLe(sampler.Get2D(), sampler.Get2D(), lambda, time);
    if (!les || les.pdfPos == 0 || les.pdfDir == 0 || !les.L)
        return 0;
    RayDifferential ray(les.ray);

    // Generate first vertex on light subpath and start random walk
    path[0] = les.intr ? Vertex::CreateLight(light, ray, *les.intr, les.L,
                                             les.pdfPos * lightPDF)
                       : Vertex::CreateLight(light, ray, les.L, les.pdfPos * lightPDF);
    SampledSpectrum beta =
        les.L * les.AbsCosTheta(ray.d) / (lightPDF * les.pdfPos * les.pdfDir);
    PBRT_DBG("%s\n",
             StringPrintf(
                 "Starting light subpath. Ray: %s, Le %s, beta %s, pdfPos %f, pdfDir %f",
                 ray, les.L, beta, les.pdfPos, les.pdfDir)
                 .c_str());
    int nVertices = RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer,
                               beta, les.pdfDir, maxDepth - 1, TransportMode::Importance,
                               path + 1, regularize);
    // Correct subpath sampling densities for infinite area lights
    if (path[0].IsInfiniteLight()) {
        // Set spatial density of _path[1]_ for infinite area light
        if (nVertices > 0) {
            path[1].pdfFwd = les.pdfPos;
            if (path[1].IsOnSurface())
                path[1].pdfFwd *= AbsDot(ray.d, path[1].ng());
        }

        // Set spatial density of _path[0]_ for infinite area light
        path[0].pdfFwd =
            InfiniteLightDensity(integrator.infiniteLights, lightSampler, ray.d);
    }

    return nVertices + 1;
}